

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

Vec4 __thiscall
tcu::TextureCubeView::sample
          (TextureCubeView *this,Sampler *sampler,float s,float t,float r,float lod)

{
  undefined8 *puVar1;
  uint uVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  float s_00;
  int iVar7;
  ulong uVar8;
  int depth;
  long lVar9;
  long in_RDX;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  Sampler *sampler_00;
  long lVar14;
  bool *pbVar15;
  float t_00;
  float fVar16;
  undefined4 extraout_XMM0_Db;
  undefined8 extraout_XMM0_Qa;
  ulong uVar17;
  Vec4 VVar18;
  Vector<float,_4> VVar19;
  Vec4 VVar20;
  CubeFaceFloatCoords CVar23;
  Vec4 t1;
  Vec4 t0;
  ConstPixelBufferAccess faceAccesses [6];
  ConstPixelBufferAccess faceAccesses1 [6];
  TextureFormat local_248;
  int aiStack_240 [2];
  TextureFormat local_238;
  int aiStack_230 [2];
  undefined1 local_228 [16];
  ConstPixelBufferAccess local_218 [6];
  ConstPixelBufferAccess local_128 [6];
  Vec4 VVar21;
  Vec4 VVar22;
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  
  local_218[0].m_format.order = (ChannelOrder)s;
  local_218[0].m_format.type = (ChannelType)t;
  local_218[0].m_size.m_data[0] = (int)r;
  CVar23 = getCubeFaceCoords((Vec3 *)local_218);
  t_00 = CVar23.t;
  uVar8 = CVar23._0_8_;
  uVar17 = CONCAT44(extraout_XMM0_Db,t_00);
  s_00 = CVar23.s;
  depth = (int)in_RDX;
  if (*(char *)(in_RDX + 0x34) != '\x01') {
    VVar18 = sampleLevelArray2D((ConstPixelBufferAccess *)this,
                                (int)*(undefined8 *)(&sampler->wrapR + (uVar8 & 0xffffffff) * 2),
                                (Sampler *)(ulong)sampler->wrapS,s_00,t_00,depth,lod);
    VVar18.m_data[0] = VVar18.m_data[0];
    auVar26._4_4_ = VVar18.m_data[1];
    register0x00001240 = VVar18.m_data[2];
    register0x00001244 = VVar18.m_data[3];
    return (Vec4)VVar18.m_data;
  }
  uVar2 = *(uint *)(in_RDX + 0xc + (ulong)(lod <= *(float *)(in_RDX + 0x14)) * 4);
  if (5 < uVar2) {
    Vector<float,_4>::Vector((Vector<float,_4> *)this,0.0);
    VVar22.m_data[0] = (float)(int)extraout_XMM0_Qa;
    auVar27._4_4_ = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
    register0x00001240 = (float)(int)uVar17;
    register0x00001244 = (float)(int)(uVar17 >> 0x20);
    return (Vec4)VVar22.m_data;
  }
  pbVar15 = (bool *)&sampler->wrapR;
  switch(uVar2) {
  case 0:
    sampler_00 = *(Sampler **)((long)pbVar15 + (uVar8 & 0xffffffff) * 2 * 4);
    break;
  case 1:
    lVar14 = 0;
    do {
      ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)((long)local_218[0].m_size.m_data + lVar14 + -8));
      lVar14 = lVar14 + 0x28;
    } while (lVar14 != 0xf0);
    for (lVar14 = 0; lVar14 != 0x1e; lVar14 = lVar14 + 5) {
      puVar1 = *(undefined8 **)pbVar15;
      *(void **)((long)(&local_218[0].m_pitch + 1) + lVar14 * 8) = (void *)puVar1[4];
      uVar4 = *puVar1;
      uVar5 = puVar1[1];
      uVar6 = puVar1[3];
      *(undefined8 *)(local_218[0].m_pitch.m_data + lVar14 * 2 + -1) = puVar1[2];
      *(undefined8 *)(local_218[0].m_pitch.m_data + lVar14 * 2 + 1) = uVar6;
      *(undefined8 *)(local_218[0].m_size.m_data + lVar14 * 2 + -2) = uVar4;
      *(undefined8 *)(local_218[0].m_size.m_data + lVar14 * 2) = uVar5;
      pbVar15 = pbVar15 + 8;
    }
LAB_001f2cc7:
    VVar18 = sampleCubeSeamlessLinear
                       ((ConstPixelBufferAccess (*) [6])this,(CubeFace)local_218,
                        (Sampler *)(uVar8 & 0xffffffff),s_00,t_00,depth);
    VVar20.m_data[0] = VVar18.m_data[0];
    auVar24._4_4_ = VVar18.m_data[1];
    register0x00001240 = VVar18.m_data[2];
    register0x00001244 = VVar18.m_data[3];
    return (Vec4)VVar20.m_data;
  default:
    iVar12 = sampler->wrapS - CLAMP_TO_BORDER;
    fVar16 = ceilf(lod + 0.5);
    iVar13 = (int)fVar16 + -1;
    if (iVar13 < iVar12) {
      iVar12 = iVar13;
    }
    iVar7 = 0;
    if (-1 < iVar13) {
      iVar7 = iVar12;
    }
    if (uVar2 == 4) {
      lVar14 = 0;
      do {
        ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)((long)local_218[0].m_size.m_data + lVar14 + -8));
        lVar14 = lVar14 + 0x28;
      } while (lVar14 != 0xf0);
      lVar9 = (long)iVar7 * 0x28;
      for (lVar14 = 0; lVar14 != 0x1e; lVar14 = lVar14 + 5) {
        lVar10 = *(long *)pbVar15;
        *(void **)((long)(&local_218[0].m_pitch + 1) + lVar14 * 8) =
             *(void **)(lVar10 + 0x20 + lVar9);
        uVar4 = *(undefined8 *)(lVar10 + lVar9);
        uVar5 = ((undefined8 *)(lVar10 + lVar9))[1];
        puVar1 = (undefined8 *)(lVar10 + 0x10 + lVar9);
        uVar6 = puVar1[1];
        *(undefined8 *)(local_218[0].m_pitch.m_data + lVar14 * 2 + -1) = *puVar1;
        *(undefined8 *)(local_218[0].m_pitch.m_data + lVar14 * 2 + 1) = uVar6;
        *(undefined8 *)(local_218[0].m_size.m_data + lVar14 * 2 + -2) = uVar4;
        *(undefined8 *)(local_218[0].m_size.m_data + lVar14 * 2) = uVar5;
        pbVar15 = pbVar15 + 8;
      }
      goto LAB_001f2cc7;
    }
    sampler_00 = (Sampler *)
                 ((long)iVar7 * 0x28 + *(long *)((long)pbVar15 + (uVar8 & 0xffffffff) * 2 * 4));
    uVar17 = (ulong)(uint)t_00;
    break;
  case 3:
  case 5:
    iVar13 = sampler->wrapS - CLAMP_TO_BORDER;
    fVar16 = floorf(lod);
    iVar7 = (int)fVar16;
    iVar12 = iVar13;
    if (iVar7 < iVar13) {
      iVar12 = iVar7;
    }
    iVar11 = 0;
    if (-1 < iVar7) {
      iVar11 = iVar12;
    }
    if (iVar11 + 1 <= iVar13) {
      iVar13 = iVar11 + 1;
    }
    Vector<float,_4>::Vector((Vector<float,_4> *)&local_238);
    Vector<float,_4>::Vector((Vector<float,_4> *)&local_248);
    if (uVar2 == 5) {
      lVar14 = 0;
      do {
        ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)((long)local_218[0].m_size.m_data + lVar14 + -8));
        lVar14 = lVar14 + 0x28;
      } while (lVar14 != 0xf0);
      lVar14 = 0;
      do {
        ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)((long)local_128[0].m_size.m_data + lVar14 + -8));
        lVar14 = lVar14 + 0x28;
      } while (lVar14 != 0xf0);
      lVar9 = (long)iVar11 * 0x28;
      lVar10 = (long)iVar13 * 0x28;
      for (lVar14 = 0; lVar14 != 0x1e; lVar14 = lVar14 + 5) {
        lVar3 = *(long *)pbVar15;
        *(void **)((long)(&local_218[0].m_pitch + 1) + lVar14 * 8) =
             *(void **)(lVar3 + 0x20 + lVar9);
        uVar4 = *(undefined8 *)(lVar3 + lVar9);
        uVar5 = ((undefined8 *)(lVar3 + lVar9))[1];
        puVar1 = (undefined8 *)(lVar3 + 0x10 + lVar9);
        uVar6 = puVar1[1];
        *(undefined8 *)(local_218[0].m_pitch.m_data + lVar14 * 2 + -1) = *puVar1;
        *(undefined8 *)(local_218[0].m_pitch.m_data + lVar14 * 2 + 1) = uVar6;
        *(undefined8 *)(local_218[0].m_size.m_data + lVar14 * 2 + -2) = uVar4;
        *(undefined8 *)(local_218[0].m_size.m_data + lVar14 * 2) = uVar5;
        uVar4 = ((undefined8 *)(lVar3 + lVar10))[1];
        puVar1 = (undefined8 *)(lVar3 + 0x10 + lVar10);
        uVar5 = *puVar1;
        uVar6 = puVar1[1];
        *(undefined8 *)(local_128[0].m_size.m_data + lVar14 * 2 + -2) =
             *(undefined8 *)(lVar3 + lVar10);
        *(undefined8 *)(local_128[0].m_size.m_data + lVar14 * 2) = uVar4;
        *(undefined8 *)(local_128[0].m_pitch.m_data + lVar14 * 2 + -1) = uVar5;
        *(undefined8 *)(local_128[0].m_pitch.m_data + lVar14 * 2 + 1) = uVar6;
        *(void **)((long)(&local_128[0].m_pitch + 1) + lVar14 * 8) =
             *(void **)(lVar3 + 0x20 + lVar10);
        pbVar15 = pbVar15 + 8;
      }
      sampleCubeSeamlessLinear
                ((ConstPixelBufferAccess (*) [6])local_228,(CubeFace)local_218,
                 (Sampler *)(uVar8 & 0xffffffff),s_00,t_00,depth);
      local_238.order = local_228._0_4_;
      local_238.type = local_228._4_4_;
      aiStack_230[0] = local_228._8_4_;
      aiStack_230[1] = local_228._12_4_;
      sampleCubeSeamlessLinear
                ((ConstPixelBufferAccess (*) [6])local_228,(CubeFace)local_128,
                 (Sampler *)(uVar8 & 0xffffffff),s_00,t_00,depth);
      local_248.order = local_228._0_4_;
      local_248.type = local_228._4_4_;
      aiStack_240[0] = local_228._8_4_;
      aiStack_240[1] = local_228._12_4_;
    }
    else {
      sampleCubeSeamlessNearest
                (local_218,
                 (Sampler *)
                 ((long)iVar11 * 0x28 + *(long *)((long)pbVar15 + (uVar8 & 0xffffffff) * 2 * 4)),
                 s_00,t_00,depth);
      local_238.type = local_218[0].m_format.type;
      local_238.order = local_218[0].m_format.order;
      aiStack_230[1] = local_218[0].m_size.m_data[1];
      aiStack_230[0] = local_218[0].m_size.m_data[0];
      sampleCubeSeamlessNearest
                (local_218,
                 (Sampler *)
                 ((long)iVar13 * 0x28 + *(long *)((long)pbVar15 + (uVar8 & 0xffffffff) * 2 * 4)),
                 s_00,t_00,depth);
      local_248.type = local_218[0].m_format.type;
      local_248.order = local_218[0].m_format.order;
      aiStack_240[1] = local_218[0].m_size.m_data[1];
      aiStack_240[0] = local_218[0].m_size.m_data[0];
    }
    operator*((tcu *)local_218,1.0 - (lod - fVar16),(Vector<float,_4> *)&local_238);
    operator*((tcu *)local_128,lod - fVar16,(Vector<float,_4> *)&local_248);
    VVar19 = operator+((tcu *)this,(Vector<float,_4> *)local_218,(Vector<float,_4> *)local_128);
    VVar21.m_data[0] = VVar19.m_data[0];
    auVar25._4_4_ = VVar19.m_data[1];
    register0x00001240 = VVar19.m_data[2];
    register0x00001244 = VVar19.m_data[3];
    return (Vec4)VVar21.m_data;
  }
  VVar18 = sampleCubeSeamlessNearest
                     ((ConstPixelBufferAccess *)this,sampler_00,s_00,(float)uVar17,depth);
  return (Vec4)VVar18.m_data;
}

Assistant:

tcu::Vec4 TextureCubeView::sample (const Sampler& sampler, float s, float t, float r, float lod) const
{
	DE_ASSERT(sampler.compare == Sampler::COMPAREMODE_NONE);

	// Computes (face, s, t).
	const CubeFaceFloatCoords coords = getCubeFaceCoords(Vec3(s, t, r));
	if (sampler.seamlessCubeMap)
		return sampleLevelArrayCubeSeamless(m_levels, m_numLevels, coords.face, sampler, coords.s, coords.t, 0 /* depth */, lod);
	else
		return sampleLevelArray2D(m_levels[coords.face], m_numLevels, sampler, coords.s, coords.t, 0 /* depth */, lod);
}